

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::OneofMessage::GenerateCopyConstructorCode
          (OneofMessage *this,Printer *p)

{
  if ((this->super_SingularMessage).has_hasbit_ != true) {
    google::protobuf::io::Printer::Emit
              (p,0,0,0x90,
               "\n    if (from._internal_has_$name$()) {\n      _this->$field_$ =\n          $superclass$::CopyConstruct<$Submsg$>(arena, *from.$field_$);\n    }\n  "
              );
    return;
  }
  (anonymous_namespace)::OneofMessage::GenerateCopyConstructorCode();
  return;
}

Assistant:

void OneofMessage::GenerateCopyConstructorCode(io::Printer* p) const {
  ABSL_CHECK(!has_hasbit_);
  p->Emit(R"cc(
    if (from._internal_has_$name$()) {
      _this->$field_$ =
          $superclass$::CopyConstruct<$Submsg$>(arena, *from.$field_$);
    }
  )cc");
}